

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O0

size_t decodeQuantum(uchar *dest,char *src)

{
  uchar uVar1;
  bool bVar2;
  long local_50;
  unsigned_long v;
  unsigned_long x;
  unsigned_long i;
  char *p;
  char *s;
  size_t padding;
  char *src_local;
  uchar *dest_local;
  
  s = (char *)0x0;
  v = 0;
  x = 0;
  p = src;
  do {
    if (3 < x) {
      if (s == (char *)0x0) {
        uVar1 = curlx_ultouc(v & 0xff);
        dest[2] = uVar1;
      }
      if (s < (char *)0x2) {
        uVar1 = curlx_ultouc(v >> 8 & 0xff);
        dest[1] = uVar1;
      }
      uVar1 = curlx_ultouc(v >> 0x10 & 0xff);
      *dest = uVar1;
      return 3 - (long)s;
    }
    local_50 = 0;
    if (*p == '=') {
      v = v << 6;
      s = s + 1;
    }
    else {
      i = (unsigned_long)base64;
      while( true ) {
        bVar2 = false;
        if (*(char *)i != '\0') {
          bVar2 = *(char *)i != *p;
        }
        if (!bVar2) break;
        local_50 = local_50 + 1;
        i = i + 1;
      }
      if (*(char *)i != *p) {
        return 0;
      }
      v = v * 0x40 + local_50;
    }
    x = x + 1;
    p = p + 1;
  } while( true );
}

Assistant:

static size_t decodeQuantum(unsigned char *dest, const char *src)
{
  size_t padding = 0;
  const char *s, *p;
  unsigned long i, x = 0;

  for(i = 0, s = src; i < 4; i++, s++) {
    unsigned long v = 0;

    if(*s == '=') {
      x = (x << 6);
      padding++;
    }
    else {
      p = base64;

      while(*p && (*p != *s)) {
        v++;
        p++;
      }

      if(*p == *s)
        x = (x << 6) + v;
      else
        return 0;
    }
  }

  if(padding < 1)
    dest[2] = curlx_ultouc(x & 0xFFUL);

  x >>= 8;
  if(padding < 2)
    dest[1] = curlx_ultouc(x & 0xFFUL);

  x >>= 8;
  dest[0] = curlx_ultouc(x & 0xFFUL);

  return 3 - padding;
}